

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O2

DdNode * extraBddSpaceEquationsNeg(DdManager *dd,DdNode *bF)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *E;
  DdNode *T;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  ulong uVar6;
  
  pDVar2 = dd->one;
  if ((DdNode *)((ulong)pDVar2 ^ 1) == bF) {
    return pDVar2;
  }
  if (pDVar2 == bF) {
    return dd->zero;
  }
  pDVar2 = cuddCacheLookup1Zdd(dd,extraBddSpaceEquationsNeg,bF);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  pDVar4 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  pDVar2 = (pDVar4->type).kids.E;
  if (pDVar4 == bF) {
    pDVar5 = (pDVar4->type).kids.T;
  }
  else {
    pDVar2 = (DdNode *)((ulong)pDVar2 ^ 1);
    pDVar5 = (DdNode *)((ulong)(pDVar4->type).kids.T ^ 1);
  }
  pDVar3 = (DdNode *)((ulong)dd->one ^ 1);
  if (pDVar2 == pDVar3) {
    pDVar2 = extraBddSpaceEquationsNeg(dd,pDVar5);
    if (pDVar2 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    goto LAB_0067e6d1;
  }
  E = extraBddSpaceEquationsNeg(dd,pDVar2);
  if (pDVar5 != pDVar3) {
    if (E == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar2 = extraBddSpaceEquationsNeg(dd,pDVar5);
    if (pDVar2 == (DdNode *)0x0) goto LAB_0067e70e;
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar5 = extraBddSpaceEquationsPos(dd,pDVar5);
    if (pDVar5 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar3 = cuddZddIntersect(dd,E,pDVar2);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        T = cuddZddIntersect(dd,E,pDVar5);
        if (T == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,pDVar3);
          Cudd_RecursiveDerefZdd(dd,pDVar5);
          Cudd_RecursiveDerefZdd(dd,E);
          E = pDVar2;
          goto LAB_0067e70e;
        }
        uVar6 = (ulong)T & 0xfffffffffffffffe;
        *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + 1;
        Cudd_RecursiveDerefZdd(dd,pDVar5);
        Cudd_RecursiveDerefZdd(dd,E);
        Cudd_RecursiveDerefZdd(dd,pDVar2);
        pDVar2 = cuddZddGetNode(dd,pDVar4->index * 2,T,pDVar3);
        if (pDVar2 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,pDVar3);
          E = T;
          goto LAB_0067e70e;
        }
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        goto LAB_0067e6cd;
      }
      Cudd_RecursiveDerefZdd(dd,pDVar5);
    }
    Cudd_RecursiveDerefZdd(dd,E);
    E = pDVar2;
LAB_0067e70e:
    Cudd_RecursiveDerefZdd(dd,E);
    return (DdNode *)0x0;
  }
  if (E == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  uVar6 = (ulong)E & 0xfffffffffffffffe;
  *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + 1;
  pDVar2 = cuddZddGetNode(dd,pDVar4->index * 2,dd->one,E);
  if (pDVar2 == (DdNode *)0x0) goto LAB_0067e70e;
LAB_0067e6cd:
  *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + -1;
LAB_0067e6d1:
  cuddCacheInsert1(dd,extraBddSpaceEquationsNeg,bF,pDVar2);
  return pDVar2;
}

Assistant:

DdNode * extraBddSpaceEquationsNeg( DdManager * dd, DdNode * bF )
{
	DdNode * zRes;
	statLine( dd );

	if ( bF == b0 )
		return z1;
	if ( bF == b1 )
		return z0;
	
    if ( (zRes = cuddCacheLookup1Zdd(dd, extraBddSpaceEquationsNeg, bF)) )
    	return zRes;
	else
	{
		DdNode * bFR, * bF0,  * bF1;
		DdNode * zPos0, * zPos1, * zNeg1; 
		DdNode * zRes, * zRes0, * zRes1;

		bFR = Cudd_Regular(bF);
		if ( bFR != bF ) // bF is complemented 
		{
			bF0 = Cudd_Not( cuddE(bFR) );
			bF1 = Cudd_Not( cuddT(bFR) );
		}
		else
		{
			bF0 = cuddE(bFR);
			bF1 = cuddT(bFR);
		}

		if ( bF0 == b0 )
		{
			zRes = extraBddSpaceEquationsNeg( dd, bF1 );
			if ( zRes == NULL )
				return NULL;
		}
		else if ( bF1 == b0 )
		{
			zRes0 = extraBddSpaceEquationsNeg( dd, bF0 );
			if ( zRes0 == NULL )
				return NULL;
			cuddRef( zRes0 );

			// add the current element to the set
			zRes = cuddZddGetNode( dd, 2*bFR->index, z1, zRes0 );
			if ( zRes == NULL ) 
			{
				Cudd_RecursiveDerefZdd(dd, zRes0);
				return NULL;
			}
			cuddDeref( zRes0 );
		}
		else
		{
			zPos0 = extraBddSpaceEquationsNeg( dd, bF0 );
			if ( zPos0 == NULL )
				return NULL;
			cuddRef( zPos0 );

			zPos1 = extraBddSpaceEquationsNeg( dd, bF1 );
			if ( zPos1 == NULL )
			{
				Cudd_RecursiveDerefZdd(dd, zPos0);
				return NULL;
			}
			cuddRef( zPos1 );

			zNeg1 = extraBddSpaceEquationsPos( dd, bF1 );
			if ( zNeg1 == NULL )
			{
				Cudd_RecursiveDerefZdd(dd, zPos0);
				Cudd_RecursiveDerefZdd(dd, zPos1);
				return NULL;
			}
			cuddRef( zNeg1 );


			zRes0 = cuddZddIntersect( dd, zPos0, zPos1 );
			if ( zRes0 == NULL )
			{
				Cudd_RecursiveDerefZdd(dd, zNeg1);
				Cudd_RecursiveDerefZdd(dd, zPos0);
				Cudd_RecursiveDerefZdd(dd, zPos1);
				return NULL;
			}
			cuddRef( zRes0 );

			zRes1 = cuddZddIntersect( dd, zPos0, zNeg1 );
			if ( zRes1 == NULL )
			{
				Cudd_RecursiveDerefZdd(dd, zRes0);
				Cudd_RecursiveDerefZdd(dd, zNeg1);
				Cudd_RecursiveDerefZdd(dd, zPos0);
				Cudd_RecursiveDerefZdd(dd, zPos1);
				return NULL;
			}
			cuddRef( zRes1 );
			Cudd_RecursiveDerefZdd(dd, zNeg1);
			Cudd_RecursiveDerefZdd(dd, zPos0);
			Cudd_RecursiveDerefZdd(dd, zPos1);
			// only zRes0 and zRes1 are refed at this point

			zRes = cuddZddGetNode( dd, 2*bFR->index, zRes1, zRes0 );
			if ( zRes == NULL ) 
			{
				Cudd_RecursiveDerefZdd(dd, zRes0);
				Cudd_RecursiveDerefZdd(dd, zRes1);
				return NULL;
			}
			cuddDeref( zRes0 );
			cuddDeref( zRes1 );
		}

		cuddCacheInsert1( dd, extraBddSpaceEquationsNeg, bF, zRes );
		return zRes;
	}
}